

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall display::test_method(display *this)

{
  string *psVar1;
  long *plVar2;
  size_t sVar3;
  undefined1 local_240 [16];
  shared_count local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined **local_208;
  undefined1 local_200;
  undefined8 *local_1f8;
  char **local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  output_test_stream output;
  
  psVar1 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"my-entity",(allocator<char> *)&local_208);
  plVar2 = (long *)dynamicgraph::PoolStorage::getEntity(psVar1);
  std::__cxx11::string::~string((string *)&output);
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_1b8,1);
  (**(code **)(*plVar2 + 0x30))(plVar2,&output);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0xb1);
  local_1e8 = "CustomEntity: my-entity";
  sVar3 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("CustomEntity: my-entity");
  local_1e0 = "CustomEntity: my-entity" + sVar3;
  boost::test_tools::output_test_stream::is_equal(local_240,&output,&local_1e8,1);
  local_1f0 = &local_218;
  local_218 = "output.is_equal(\"CustomEntity: my-entity\")";
  local_210 = "";
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00137c00;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_220 = "";
  boost::test_tools::tt_detail::report_assertion(local_240,&local_208,&local_228,0xb1,1,0,0);
  boost::detail::shared_count::~shared_count(&local_230);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(display) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  output_test_stream output;

  entity.display(output);
  BOOST_CHECK(output.is_equal("CustomEntity: my-entity"));
}